

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void __thiscall icu_63::SimpleTimeZone::decodeEndRule(SimpleTimeZone *this,UErrorCode *status)

{
  char cVar1;
  char cVar2;
  char cVar3;
  EMode EVar4;
  bool bVar5;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    bVar5 = this->startDay != '\0';
    cVar2 = this->endDay;
    this->useDaylight = cVar2 != '\0' && bVar5;
    if (cVar2 != '\0' && bVar5) {
      if (this->dstSavings == 0) {
        this->dstSavings = 3600000;
      }
    }
    else if (cVar2 == '\0') {
      return;
    }
    if (((0xb < (ulong)(byte)this->endMonth) || (86400000 < (uint)this->endTime)) ||
       (UTC_TIME < this->endTimeMode)) goto LAB_00200ac2;
    cVar1 = this->endDayOfWeek;
    if (cVar1 == '\0') {
      this->endMode = DOM_MODE;
    }
    else {
      EVar4 = DOW_IN_MONTH_MODE;
      cVar3 = cVar1;
      if (cVar1 < '\x01') {
        cVar3 = -cVar1;
        this->endDayOfWeek = cVar3;
        EVar4 = DOW_GE_DOM_MODE;
        if (cVar2 < '\x01') {
          cVar2 = -cVar2;
          this->endDay = cVar2;
          EVar4 = DOW_LE_DOM_MODE;
        }
      }
      this->endMode = EVar4;
      if ('\a' < cVar3) goto LAB_00200ac2;
      if ('\0' < cVar1) {
        if (0xf4 < (byte)(cVar2 - 6U)) {
          return;
        }
        goto LAB_00200ac2;
      }
    }
    if ((cVar2 < '\x01') || ((char)STATICMONTHLENGTH[(byte)this->endMonth] < cVar2)) {
LAB_00200ac2:
      *status = U_ILLEGAL_ARGUMENT_ERROR;
      return;
    }
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }